

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

int png_image_read_composite(png_voidp argument)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  png_const_structrp png_ptr_00;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int local_98;
  byte local_94;
  byte local_88;
  byte local_7c;
  uint local_78;
  png_uint_32 component;
  uint c;
  png_byte alpha;
  png_const_bytep end_row;
  png_bytep outrow;
  png_bytep inrow;
  png_uint_32 y;
  uint stepy;
  uint stepx;
  uint startx;
  int pass;
  uint channels;
  ptrdiff_t step_row;
  png_uint_32 width;
  png_uint_32 height;
  int passes;
  png_structrp png_ptr;
  png_imagep image;
  png_image_read_control *display;
  png_voidp argument_local;
  
  puVar4 = *argument;
  png_ptr_00 = *(png_const_structrp *)*puVar4;
  if (png_ptr_00->interlaced == '\0') {
    width = 1;
  }
  else {
    if (png_ptr_00->interlaced != '\x01') {
      png_error(png_ptr_00,"unknown interlace type");
    }
    width = 7;
  }
  uVar2 = *(uint *)(puVar4 + 2);
  iVar3 = *(int *)((long)puVar4 + 0xc);
  lVar5 = *(long *)((long)argument + 0x38);
  uVar6 = 1;
  if ((*(uint *)((long)puVar4 + 0x14) & 2) != 0) {
    uVar6 = 3;
  }
  stepx = 0;
  do {
    if ((int)width <= (int)stepx) {
      return 1;
    }
    if (png_ptr_00->interlaced == '\x01') {
      if ((int)stepx < 2) {
        local_88 = 3;
      }
      else {
        local_88 = (byte)((int)(7 - stepx) >> 1);
      }
      if ((int)stepx < 2) {
        local_94 = 3;
      }
      else {
        local_94 = (byte)((int)(7 - stepx) >> 1);
      }
      if (iVar3 + (((1 << (local_88 & 0x1f)) + -1) -
                  ((stepx & 1) << (3U - (char)((int)(stepx + 1) >> 1) & 0x1f) & 7)) >>
          (local_94 & 0x1f) != 0) {
        stepy = ((stepx & 1) << (3U - (char)((int)(stepx + 1) >> 1) & 0x1f) & 7) * uVar6;
        inrow._0_4_ = ((stepx ^ 0xffffffff) & 1) << (3U - (char)((int)stepx >> 1) & 0x1f) & 7;
        if ((int)stepx < 3) {
          local_98 = 8;
        }
        else {
          local_98 = 8 >> ((byte)((int)(stepx - 1) >> 1) & 0x1f);
        }
        inrow._4_4_ = local_98;
        y = (1 << ((byte)((int)(7 - stepx) >> 1) & 0x1f)) * uVar6;
        goto LAB_004156f0;
      }
    }
    else {
      inrow._0_4_ = 0;
      stepy = 0;
      inrow._4_4_ = 1;
      y = uVar6;
LAB_004156f0:
      for (; (uint)inrow < uVar2; inrow._0_4_ = inrow._4_4_ + (uint)inrow) {
        outrow = *(png_bytep *)((long)argument + 0x28);
        png_read_row(png_ptr_00,outrow,(png_bytep)0x0);
        lVar8 = (ulong)(uint)inrow * lVar5 + *(long *)((long)argument + 0x30);
        for (end_row = (png_const_bytep)(lVar8 + (ulong)stepy);
            end_row < (png_const_bytep)(lVar8 + (ulong)(iVar3 * uVar6)); end_row = end_row + y) {
          bVar1 = outrow[uVar6];
          if (bVar1 != 0) {
            for (local_78 = 0; local_78 < uVar6; local_78 = local_78 + 1) {
              local_7c = outrow[local_78];
              if (bVar1 != 0xff) {
                uVar7 = (0xff - (uint)bVar1) * (uint)png_sRGB_table[end_row[local_78]] +
                        (uint)local_7c * 0xffff;
                local_7c = (byte)((uint)png_sRGB_base[uVar7 >> 0xf] +
                                  ((uVar7 & 0x7fff) * (uint)png_sRGB_delta[uVar7 >> 0xf] >> 0xc) >>
                                 8);
              }
              end_row[local_78] = local_7c;
            }
          }
          outrow = outrow + (uVar6 + 1);
        }
      }
    }
    stepx = stepx + 1;
  } while( true );
}

Assistant:

static int
png_image_read_composite(png_voidp argument)
{
   png_image_read_control *display = png_voidcast(png_image_read_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;
   int passes;

   switch (png_ptr->interlaced)
   {
      case PNG_INTERLACE_NONE:
         passes = 1;
         break;

      case PNG_INTERLACE_ADAM7:
         passes = PNG_INTERLACE_ADAM7_PASSES;
         break;

      default:
         png_error(png_ptr, "unknown interlace type");
   }

   {
      png_uint_32  height = image->height;
      png_uint_32  width = image->width;
      ptrdiff_t    step_row = display->row_bytes;
      unsigned int channels =
          (image->format & PNG_FORMAT_FLAG_COLOR) != 0 ? 3 : 1;
      int pass;

      for (pass = 0; pass < passes; ++pass)
      {
         unsigned int     startx, stepx, stepy;
         png_uint_32      y;

         if (png_ptr->interlaced == PNG_INTERLACE_ADAM7)
         {
            /* The row may be empty for a short image: */
            if (PNG_PASS_COLS(width, pass) == 0)
               continue;

            startx = PNG_PASS_START_COL(pass) * channels;
            stepx = PNG_PASS_COL_OFFSET(pass) * channels;
            y = PNG_PASS_START_ROW(pass);
            stepy = PNG_PASS_ROW_OFFSET(pass);
         }

         else
         {
            y = 0;
            startx = 0;
            stepx = channels;
            stepy = 1;
         }

         for (; y<height; y += stepy)
         {
            png_bytep inrow = png_voidcast(png_bytep, display->local_row);
            png_bytep outrow;
            png_const_bytep end_row;

            /* Read the row, which is packed: */
            png_read_row(png_ptr, inrow, NULL);

            outrow = png_voidcast(png_bytep, display->first_row);
            outrow += y * step_row;
            end_row = outrow + width * channels;

            /* Now do the composition on each pixel in this row. */
            outrow += startx;
            for (; outrow < end_row; outrow += stepx)
            {
               png_byte alpha = inrow[channels];

               if (alpha > 0) /* else no change to the output */
               {
                  unsigned int c;

                  for (c=0; c<channels; ++c)
                  {
                     png_uint_32 component = inrow[c];

                     if (alpha < 255) /* else just use component */
                     {
                        /* This is PNG_OPTIMIZED_ALPHA, the component value
                         * is a linear 8-bit value.  Combine this with the
                         * current outrow[c] value which is sRGB encoded.
                         * Arithmetic here is 16-bits to preserve the output
                         * values correctly.
                         */
                        component *= 257*255; /* =65535 */
                        component += (255-alpha)*png_sRGB_table[outrow[c]];

                        /* So 'component' is scaled by 255*65535 and is
                         * therefore appropriate for the sRGB to linear
                         * conversion table.
                         */
                        component = PNG_sRGB_FROM_LINEAR(component);
                     }

                     outrow[c] = (png_byte)component;
                  }
               }

               inrow += channels+1; /* components and alpha channel */
            }
         }
      }
   }

   return 1;
}